

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_arg * __thiscall
fmt::v6::internal::
specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::get_arg(void *param_1,
         basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
         *param_2)

{
  basic_format_parse_context<char,_fmt::v6::internal::error_handler>::next_arg_id
            ((basic_format_parse_context<char,_fmt::v6::internal::error_handler> *)param_1);
  get_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
            (param_2,(int)((ulong)param_1 >> 0x20));
  return (format_arg *)param_1;
}

Assistant:

FMT_CONSTEXPR format_arg get_arg(auto_id) {
    return internal::get_arg(context_, parse_context_.next_arg_id());
  }